

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O3

vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *
solver1M1P<float>(vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                  *__return_storage_ptr__,
                 vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                 *ptPair,vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                         *plPair,
                 vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                 *lPair,vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                        *lCPair)

{
  undefined8 *puVar1;
  iterator __position;
  undefined1 auVar2 [16];
  XprTypeNested dst;
  undefined1 auVar3 [8];
  PointerType ptr;
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *pCVar4;
  long lVar5;
  ostream *poVar6;
  float *s;
  float *pfVar7;
  Scalar SVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  SrcEvaluatorType srcEvaluator_1;
  Matrix<float,_6,_6,_0,_6,_6> TuL1;
  Matrix<float,_4,_4,_0,_4,_4> Tu1;
  Matrix<float,_4,_1,_0,_4,_1> PiU;
  Matrix<float,_4,_4,_0,_4,_4> TV1;
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  lines1;
  Matrix<float,_4,_4,_0,_4,_4> TV2;
  Matrix<float,_4,_4,_0,_4,_4> TU1;
  Matrix<float,_4,_4,_0,_4,_4> Tu2;
  Matrix<float,_4,_1,_0,_4,_1> Pi;
  Matrix<float,_6,_6,_0,_6,_6> TuL2;
  Matrix<float,_6,_6,_0,_6,_6> TUL2;
  Matrix<float,_6,_6,_0,_6,_6> TUL1;
  Matrix<float,_4,_4,_0,_4,_4> sol;
  Matrix<float,_4,_1,_0,_4,_1> Nu;
  Matrix<float,_4,_4,_0,_4,_4> TU2;
  Matrix<float,_3,_3,_0,_3,_3> V1;
  Matrix<float,_3,_3,_0,_3,_3> V2;
  Scalar local_7bc;
  undefined1 local_7b8 [8];
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  float fStack_780;
  float fStack_77c;
  float *local_778;
  Matrix<float,_4,_4,_1,_4,_4> *local_770;
  float *local_768;
  undefined8 local_760;
  undefined1 local_758 [12];
  undefined1 auStack_74c [8];
  float fStack_744;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  float local_728 [4];
  undefined8 local_718;
  undefined8 local_710;
  undefined8 uStack_708;
  float local_700 [2];
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  float local_6e8;
  float local_6e4;
  float fStack_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float local_6d4;
  float fStack_6d0;
  float local_6cc;
  undefined1 local_6c8 [36];
  float fStack_6a4;
  undefined8 uStack_6a0;
  float local_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  undefined1 local_688 [8];
  float fStack_680;
  float fStack_67c;
  float local_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  Scalar local_660;
  Scalar local_65c;
  float local_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float local_648;
  float fStack_644;
  undefined1 local_638 [12];
  float fStack_62c;
  float fStack_628;
  float local_624;
  float local_620 [11];
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  local_5e8;
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  local_5d0;
  undefined1 local_5b8 [12];
  float fStack_5ac;
  undefined8 uStack_5a8;
  assign_op<float,_float> *local_5a0;
  float afStack_598 [8];
  Matrix<float,_4,_4,_0,_4,_4> local_578;
  undefined8 local_538;
  undefined8 uStack_530;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  undefined1 local_518 [12];
  float fStack_50c;
  undefined8 uStack_508;
  plainobjectbase_evaluator_data<float,_3> local_500;
  float afStack_4f8 [6];
  float local_4e0;
  float local_4dc;
  PointerType local_4d8 [3];
  Scalar local_4c0;
  Scalar local_4bc;
  undefined1 local_4b8 [4];
  float fStack_4b4;
  undefined1 auStack_4b0 [8];
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  variable_if_dynamic<long,__1> vStack_498;
  undefined8 uStack_490;
  undefined8 local_488;
  float fStack_480;
  undefined8 uStack_47c;
  undefined4 uStack_474;
  undefined4 uStack_470;
  undefined4 uStack_46c;
  undefined4 uStack_468;
  undefined4 uStack_464;
  variable_if_dynamic<long,__1> local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined4 local_448;
  undefined4 local_444;
  undefined4 uStack_440;
  undefined4 uStack_43c;
  undefined4 uStack_438;
  undefined4 local_434;
  undefined4 uStack_430;
  undefined4 local_42c;
  undefined1 local_428 [4];
  float fStack_424;
  undefined1 auStack_420 [8];
  float fStack_418;
  float fStack_414;
  float local_410;
  float fStack_40c;
  undefined8 uStack_408;
  variable_if_dynamic<long,__1> vStack_400;
  undefined8 local_3f8;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  float fStack_3e0;
  undefined8 local_3dc;
  float local_3d4;
  variable_if_dynamic<long,__1> local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  undefined8 uStack_3ac;
  float local_3a4;
  float fStack_3a0;
  float local_39c;
  undefined1 local_398 [4];
  float fStack_394;
  float fStack_390;
  undefined1 auStack_38c [16];
  float fStack_37c;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 local_368;
  float fStack_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  variable_if_dynamic<long,__1> local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  float local_328;
  float fStack_324;
  float fStack_320;
  undefined8 uStack_31c;
  float local_314;
  float fStack_310;
  float local_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  undefined1 local_2e8 [12];
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  SrcEvaluatorType local_2a8;
  Matrix<float,_4,_4,_0,_4,_4> local_298;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  long lStack_210;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  ulong uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  Product<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_1>
  local_140;
  Matrix<float,_3,_3,_0,_3,_3> *local_120 [5];
  Matrix<float,_3,_1,_0,_3,_1> local_f8;
  Matrix<float,_3,_1,_0,_3,_1> local_e8;
  Matrix<float,_3,_1,_0,_3,_1> local_d8;
  Matrix<float,_3,_1,_0,_3,_1> local_c8;
  float local_bc [9];
  PointerType local_98 [2];
  PointerType local_88 [2];
  pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  local_78;
  
  pfVar7 = *(float **)lCPair;
  if ((*(float **)(lCPair + 8) == pfVar7) &&
     ((ulong)(*(long *)(plPair + 8) - *(long *)plPair) < 0x21)) {
    poVar6 = std::operator<<((ostream *)&std::cerr,
                             "Solver 1M1P requires at least 1 line and 1 plane correspondence!");
    std::endl<char,std::char_traits<char>>(poVar6);
    exit(-1);
  }
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar1 = *(undefined8 **)plPair;
  local_4d8[0] = (PointerType)*puVar1;
  local_4d8[1]._0_4_ = *(float *)((long)(puVar1 + 1) + 0);
  local_4d8[1]._4_4_ = *(float *)((long)(puVar1 + 1) + 4);
  local_2a8.super_block_evaluator<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_Eigen::Matrix<float,__1,__1,_0,_4,_4>_>
  .m_data = (PointerType)puVar1[2];
  local_2a8.super_block_evaluator<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_Eigen::Matrix<float,__1,__1,_0,_4,_4>_>
  ._8_4_ = *(float *)((long)(puVar1 + 3) + 0);
  local_2a8.super_block_evaluator<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_Eigen::Matrix<float,__1,__1,_0,_4,_4>_>
  ._12_4_ = *(float *)((long)(puVar1 + 3) + 4);
  local_78.first.first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
  array._0_8_ = *(undefined8 *)pfVar7;
  local_78.first.first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
  array._8_8_ = *(undefined8 *)(pfVar7 + 2);
  local_78.first.second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array._0_8_ = *(undefined8 *)(pfVar7 + 4);
  local_78.first.second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array._8_8_ = *(undefined8 *)(pfVar7 + 6);
  local_78.second.first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array._0_8_ = *(undefined8 *)(pfVar7 + 8);
  local_78.second.first.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array._8_8_ = *(undefined8 *)(pfVar7 + 10);
  local_78.second.second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array._0_8_ = *(undefined8 *)(pfVar7 + 0xc);
  local_78.second.second.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array._8_8_ = *(undefined8 *)(pfVar7 + 0xe);
  getPluckerCoord<float>(&local_5d0,&local_78);
  _local_398 = (XprTypeNested)local_4d8;
  fStack_390 = 4.2039e-45;
  auStack_38c._0_4_ = 0.0;
  uStack_378 = 0;
  local_368 = 4;
  fStack_360 = SUB84(local_5d0.
                     super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,0);
  fStack_35c = (float)((ulong)local_5d0.
                              super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 0x20);
  fStack_358 = 4.2039e-45;
  fStack_354 = 0.0;
  local_340.m_value = 0;
  local_330 = 6;
  local_410 = fStack_360;
  fStack_40c = fStack_35c;
  fStack_348 = fStack_360;
  fStack_344 = fStack_35c;
  unique0x100049b0 = _local_398;
  auStack_420 = (undefined1  [8])_local_398;
  SVar8 = Eigen::internal::
          redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>const,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>const>>,3,0>
          ::
          run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                    ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                      *)local_428,(scalar_sum_op<float,_float> *)local_758,
                     (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                      *)local_398);
  if (1e-06 <= ABS(SVar8)) {
    local_88[0] = local_4d8[0];
    local_88[1] = local_4d8[1];
    local_98[0] = local_2a8.
                  super_block_evaluator<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
                  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_Eigen::Matrix<float,__1,__1,_0,_4,_4>_>
                  .m_data;
    local_98[1] = (PointerType)
                  local_2a8.
                  super_block_evaluator<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
                  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_Eigen::Matrix<float,__1,__1,_0,_4,_4>_>
                  ._8_8_;
    getPredefinedTransformations1Plane3Line<float>
              (&local_5e8,(Matrix<float,_4,_1,_0,_4,_1> *)local_88,
               (Matrix<float,_4,_1,_0,_4,_1> *)local_98,false);
    local_298.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
    _0_8_ = *(undefined8 *)
             local_5e8.
             super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].
             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array;
    local_298.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
    _8_8_ = *(undefined8 *)
             (local_5e8.
              super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].
              super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 2
             );
    local_298.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
    _16_8_ = *(undefined8 *)
              (local_5e8.
               super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].
               super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array +
              4);
    local_298.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
    _24_8_ = *(undefined8 *)
              (local_5e8.
               super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].
               super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array +
              6);
    local_298.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
    _32_8_ = *(undefined8 *)
              (local_5e8.
               super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].
               super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array +
              8);
    local_298.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
    _40_8_ = *(undefined8 *)
              (local_5e8.
               super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].
               super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array +
              10);
    local_298.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
    _48_8_ = *(undefined8 *)
              (local_5e8.
               super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].
               super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array +
              0xc);
    local_298.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
    _56_8_ = *(undefined8 *)
              (local_5e8.
               super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].
               super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array +
              0xe);
    local_578.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
    _0_8_ = *(undefined8 *)
             local_5e8.
             super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-2].
             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array;
    local_578.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
    _8_8_ = *(undefined8 *)
             (local_5e8.
              super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-2].
              super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 2
             );
    local_578.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
    _16_8_ = *(undefined8 *)
              (local_5e8.
               super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-2].
               super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array +
              4);
    local_578.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
    _24_8_ = *(undefined8 *)
              (local_5e8.
               super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-2].
               super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array +
              6);
    local_578.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
    _32_8_ = *(undefined8 *)
              (local_5e8.
               super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-2].
               super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array +
              8);
    local_578.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
    _40_8_ = *(undefined8 *)
              (local_5e8.
               super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-2].
               super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array +
              10);
    local_578.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
    _48_8_ = *(undefined8 *)
              (local_5e8.
               super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-2].
               super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array +
              0xc);
    local_578.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
    _56_8_ = *(undefined8 *)
              (local_5e8.
               super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-2].
               super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array +
              0xe);
    local_398 = (undefined1  [4])0x3f800000;
    fStack_394 = 0.0;
    fStack_390 = 0.0;
    auStack_38c._0_4_ = 0.0;
    auStack_38c._4_4_ = 0.0;
    auStack_38c._8_4_ = 0.0;
    auStack_38c._12_4_ = 0.0;
    fStack_37c = 1.0;
    uStack_378 = 0;
    uStack_370 = 0;
    local_368 = 0;
    fStack_360 = 1.0;
    fStack_35c = 0.0;
    fStack_358 = 0.0;
    fStack_354 = 0.0;
    fStack_350 = 0.0;
    fStack_34c = 0.0;
    fStack_348 = 0.0;
    fStack_344 = 1.0;
    local_340.m_value = 0;
    uStack_338 = 0;
    local_330 = 0;
    local_328 = 1.0;
    fStack_324 = 0.0;
    fStack_320 = 0.0;
    uStack_31c = 0;
    local_314 = 0.0;
    fStack_310 = 0.0;
    local_30c = 1.0;
    local_428 = (undefined1  [4])0x3f800000;
    fStack_424 = 0.0;
    auStack_420._0_4_ = 0.0;
    auStack_420._4_4_ = 0.0;
    fStack_418 = 0.0;
    fStack_414 = 0.0;
    local_410 = 0.0;
    fStack_40c = 1.0;
    uStack_408 = 0;
    vStack_400.m_value = 0;
    local_3f8 = 0;
    fStack_3f0 = 1.0;
    fStack_3ec = 0.0;
    fStack_3e8 = 0.0;
    fStack_3e4 = 0.0;
    fStack_3e0 = 0.0;
    local_3dc = 0;
    local_3d4 = 1.0;
    local_3d0.m_value = 0;
    uStack_3c8 = 0;
    local_3c0 = 0;
    local_3b8 = 1.0;
    fStack_3b4 = 0.0;
    fStack_3b0 = 0.0;
    uStack_3ac = 0;
    local_3a4 = 0.0;
    fStack_3a0 = 0.0;
    local_39c = 1.0;
    local_758._8_4_ = 4.2039e-45;
    auStack_74c._0_4_ = 0.0;
    auStack_74c._4_4_ = 4.2039e-45;
    fStack_744 = 0.0;
    local_738._0_4_ = 0.0;
    local_738._4_4_ = 0.0;
    uStack_730._0_4_ = 0.0;
    uStack_730._4_4_ = 0.0;
    local_728[0] = 8.40779e-45;
    local_728[1] = 0.0;
    uStack_4a8 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>
                  *)local_518;
    local_7b8 = (undefined1  [8])&local_578;
    local_5e8.
    super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_5e8.
         super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -2;
    _local_4b8 = (non_const_type)local_6c8;
    auStack_4b0 = (undefined1  [8])local_7b8;
    local_758._0_8_ =
         (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
          *)local_398;
    local_4a0 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
                 *)local_758;
    uStack_740 = (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                  *)local_398;
    local_6c8._0_8_ =
         (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
          *)local_398;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
           *)local_4b8);
    local_758._0_8_ = &fStack_344;
    local_758._8_4_ = 4.2039e-45;
    auStack_74c._0_4_ = 0.0;
    auStack_74c._4_4_ = 4.2039e-45;
    fStack_744 = 0.0;
    local_738._0_4_ = 4.2039e-45;
    local_738._4_4_ = 0.0;
    uStack_730._0_4_ = 4.2039e-45;
    uStack_730._4_4_ = 0.0;
    local_728[0] = 8.40779e-45;
    local_728[1] = 0.0;
    uStack_4a8 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>
                  *)local_518;
    local_7b8 = (undefined1  [8])&local_578;
    _local_4b8 = (non_const_type)local_6c8;
    auStack_4b0 = (undefined1  [8])local_7b8;
    local_6c8._0_8_ = local_758._0_8_;
    local_4a0 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
                 *)local_758;
    uStack_740 = (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                  *)local_398;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
           *)local_4b8);
    local_c8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         local_578.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
         array[0xc];
    local_c8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
         local_578.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
         array[0xd];
    local_c8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         local_578.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
         array[0xe];
    getSkew<float>((Matrix<float,_3,_3,_0,_3,_3> *)local_6c8,&local_c8);
    local_7b8 = (undefined1  [8])auStack_38c;
    local_710._0_4_ = 0.0;
    local_710._4_4_ = 0.0;
    uStack_708._0_4_ = 0.0;
    uStack_708._4_4_ = 0.0;
    uStack_7b0 = 3;
    local_7a8 = 3;
    local_798 = 3;
    uStack_790 = 0;
    local_788 = 6;
    local_488 = 3;
    local_758._0_8_ = local_6c8._0_8_ ^ 0x8000000080000000;
    local_758._8_4_ = -(float)local_6c8._8_4_;
    auStack_74c._0_4_ = -(float)local_6c8._12_4_;
    auStack_74c._4_4_ = -(float)local_6c8._16_4_;
    fStack_744 = -(float)local_6c8._20_4_;
    uStack_740._0_4_ = -(float)local_6c8._24_4_;
    uStack_740._4_4_ = -(float)local_6c8._28_4_;
    local_738 = CONCAT44(local_738._4_4_,local_6c8._32_4_) ^ 0x80000000;
    uStack_730 = &local_578;
    local_728[0] = 4.2039e-45;
    local_728[1] = 0.0;
    local_728[2] = 4.2039e-45;
    local_728[3] = 0.0;
    local_700[0] = 5.60519e-45;
    local_700[1] = 0.0;
    fStack_6e0 = 4.2039e-45;
    fStack_6dc = 0.0;
    local_518._0_8_ = local_638;
    uStack_7a0 = (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                  *)local_398;
    uStack_6f8 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
                  *)local_758;
    local_6f0 = uStack_730;
    local_500.data = (float *)local_4b8;
    local_718 = uStack_730;
    local_638._0_8_ = local_4b8;
    uStack_508 = (assign_op<float,_float> *)local_5b8;
    unique0x10004a00 =
         (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
          *)local_758;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,_-1,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>,_0,_1>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>
           *)local_518);
    if ((uStack_7b0 == 3) && (local_7a8 == local_488)) {
      local_518._0_4_ = local_7b8._0_4_;
      local_518._4_4_ = local_7b8._4_4_;
      unique0x00005300 = (SrcEvaluatorType *)local_638;
      uStack_740 = (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                    *)local_7b8;
      unique0x10004928 = (assign_op<float,_float> *)local_5b8;
      local_758._0_8_ =
           (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>
            *)local_518;
      local_638._0_8_ = local_4b8;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,_-1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
             *)local_758);
      local_758._8_4_ = 4.2039e-45;
      auStack_74c._0_4_ = 0.0;
      auStack_74c._4_4_ = 4.2039e-45;
      fStack_744 = 0.0;
      local_738._0_4_ = 0.0;
      local_738._4_4_ = 0.0;
      uStack_730._0_4_ = 0.0;
      uStack_730._4_4_ = 0.0;
      local_728[0] = 8.40779e-45;
      local_728[1] = 0.0;
      local_7b8 = (undefined1  [8])&local_298;
      _local_4b8 = (non_const_type)local_6c8;
      auStack_4b0 = (undefined1  [8])local_7b8;
      local_758._0_8_ = (DstXprType *)local_428;
      local_4a0 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
                   *)local_758;
      uStack_4a8 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>
                    *)local_518;
      uStack_740 = (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                    *)local_428;
      local_6c8._0_8_ = (DstXprType *)local_428;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
             *)local_4b8);
      local_758._0_8_ = &local_3d4;
      local_758._8_4_ = 4.2039e-45;
      auStack_74c._0_4_ = 0.0;
      auStack_74c._4_4_ = 4.2039e-45;
      fStack_744 = 0.0;
      local_738._0_4_ = 4.2039e-45;
      local_738._4_4_ = 0.0;
      uStack_730._0_4_ = 4.2039e-45;
      uStack_730._4_4_ = 0.0;
      local_728[0] = 8.40779e-45;
      local_728[1] = 0.0;
      local_7b8 = (undefined1  [8])&local_298;
      auStack_4b0 = (undefined1  [8])local_7b8;
      _local_4b8 = (non_const_type)local_6c8;
      local_6c8._0_8_ = local_758._0_8_;
      local_4a0 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
                   *)local_758;
      uStack_4a8 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>
                    *)local_518;
      uStack_740 = (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                    *)local_428;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
             *)local_4b8);
      local_d8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
           = local_298.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[0xc];
      local_d8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
           = local_298.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[0xd];
      local_d8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
           = local_298.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[0xe];
      getSkew<float>((Matrix<float,_3,_3,_0,_3,_3> *)local_6c8,&local_d8);
      local_7b8 = (undefined1  [8])(auStack_420 + 4);
      local_710._0_4_ = 0.0;
      local_710._4_4_ = 0.0;
      uStack_708._0_4_ = 0.0;
      uStack_708._4_4_ = 0.0;
      uStack_7b0 = 3;
      local_7a8 = 3;
      uStack_7a0 = (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                    *)local_428;
      local_798 = 3;
      uStack_790 = 0;
      local_788 = 6;
      local_488 = 3;
      local_758._0_8_ = local_6c8._0_8_ ^ 0x8000000080000000;
      local_758._8_4_ = -(float)local_6c8._8_4_;
      auStack_74c._0_4_ = -(float)local_6c8._12_4_;
      auStack_74c._4_4_ = -(float)local_6c8._16_4_;
      fStack_744 = -(float)local_6c8._20_4_;
      uStack_740._0_4_ = -(float)local_6c8._24_4_;
      uStack_740._4_4_ = -(float)local_6c8._28_4_;
      local_738 = CONCAT44(local_738._4_4_,local_6c8._32_4_) ^ 0x80000000;
      local_728[0] = 4.2039e-45;
      local_728[1] = 0.0;
      local_728[2] = 4.2039e-45;
      local_728[3] = 0.0;
      local_700[0] = 5.60519e-45;
      local_700[1] = 0.0;
      fStack_6e0 = 4.2039e-45;
      fStack_6dc = 0.0;
      local_518._0_8_ = local_638;
      uStack_508 = (assign_op<float,_float> *)local_5b8;
      uStack_730 = &local_298;
      uStack_6f8 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
                    *)local_758;
      local_6f0 = &local_298;
      local_500.data = (float *)local_4b8;
      local_718 = &local_298;
      local_638._0_8_ = local_4b8;
      unique0x10004a18 =
           (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
            *)local_758;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,_-1,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>,_0,_1>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>
             *)local_518);
      if ((uStack_7b0 == 3) && (local_7a8 == local_488)) {
        local_518._0_4_ = local_7b8._0_4_;
        local_518._4_4_ = local_7b8._4_4_;
        unique0x00005300 = (SrcEvaluatorType *)local_638;
        unique0x00005300 = (assign_op<float,_float> *)local_5b8;
        local_758._0_8_ =
             (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>
              *)local_518;
        uStack_740 = (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                      *)local_7b8;
        local_638._0_8_ = local_4b8;
        Eigen::internal::
        dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,_-1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
        ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
               *)local_758);
        fVar14 = ((local_5d0.
                   super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
                 [0];
        fVar10 = ((local_5d0.
                   super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
                 [3];
        fVar20 = ((local_5d0.
                   super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
                 [1];
        fVar21 = ((local_5d0.
                   super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
                 [2];
        fVar25 = ((local_5d0.
                   super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
                 [3];
        fVar26 = ((local_5d0.
                   super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
                 [4];
        fVar9 = ((local_5d0.
                  super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
                [5];
        local_658 = fStack_320 * fVar9 +
                    (float)uStack_338 * fVar26 +
                    fVar10 * fStack_350 +
                    (float)local_368 * fVar21 +
                    (float)auStack_38c._12_4_ * fVar20 + (float)local_398 * fVar14;
        fStack_654 = (float)uStack_31c * fVar9 +
                     uStack_338._4_4_ * fVar26 +
                     fVar10 * fStack_34c +
                     local_368._4_4_ * fVar21 + fStack_37c * fVar20 + fStack_394 * fVar14;
        fStack_650 = uStack_31c._4_4_ * fVar9 +
                     (float)local_330 * fVar26 +
                     fVar10 * fStack_348 +
                     fStack_360 * fVar21 + (float)uStack_378 * fVar20 + fStack_390 * fVar14;
        fStack_64c = local_314 * fVar9 +
                     local_330._4_4_ * fVar26 +
                     fVar10 * fStack_344 +
                     fStack_35c * fVar21 +
                     uStack_378._4_4_ * fVar20 + (float)auStack_38c._0_4_ * fVar14;
        local_648 = fStack_310 * fVar9 + local_328 * fVar26 + fVar25 * (float)local_340.m_value +
                    fStack_358 * fVar21 + (float)uStack_370 * fVar20 +
                    (float)auStack_38c._4_4_ * fVar14;
        fStack_644 = local_30c * fVar9 + fStack_324 * fVar26 +
                     fVar25 * (float)((ulong)local_340.m_value >> 0x20) +
                     fStack_354 * fVar21 + SUB84(uStack_370,4) * fVar20 +
                     (float)auStack_38c._8_4_ * fVar14;
        fVar14 = local_5d0.
                 super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1].
                 super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [0];
        fVar10 = local_5d0.
                 super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1].
                 super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [3];
        fVar20 = local_5d0.
                 super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1].
                 super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [1];
        fVar21 = local_5d0.
                 super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1].
                 super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [2];
        fVar25 = local_5d0.
                 super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1].
                 super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [3];
        fVar26 = local_5d0.
                 super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1].
                 super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [4];
        fVar9 = local_5d0.
                super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start[1].
                super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                [5];
        local_308 = fStack_3b0 * fVar9 +
                    (float)uStack_3c8 * fVar26 +
                    fVar10 * fStack_3e0 +
                    (float)local_3f8 * fVar21 + local_410 * fVar20 + (float)local_428 * fVar14;
        fStack_304 = (float)uStack_3ac * fVar9 +
                     uStack_3c8._4_4_ * fVar26 +
                     fVar10 * (float)local_3dc +
                     local_3f8._4_4_ * fVar21 + fStack_40c * fVar20 + fStack_424 * fVar14;
        fStack_300 = uStack_3ac._4_4_ * fVar9 +
                     (float)local_3c0 * fVar26 +
                     fVar10 * local_3dc._4_4_ +
                     fStack_3f0 * fVar21 +
                     (float)uStack_408 * fVar20 + (float)auStack_420._0_4_ * fVar14;
        fStack_2fc = local_3a4 * fVar9 +
                     local_3c0._4_4_ * fVar26 +
                     fVar10 * local_3d4 +
                     fStack_3ec * fVar21 +
                     uStack_408._4_4_ * fVar20 + (float)auStack_420._4_4_ * fVar14;
        local_688._4_4_ = fStack_304;
        local_688._0_4_ = local_308;
        fStack_680 = fStack_300;
        fStack_67c = fStack_2fc;
        fVar10 = fStack_3a0 * fVar9 + local_3b8 * fVar26 + fVar25 * (float)local_3d0.m_value +
                 fStack_3e8 * fVar21 + (float)vStack_400.m_value * fVar20 + fStack_418 * fVar14;
        fVar12 = local_39c * fVar9 + fStack_3b4 * fVar26 +
                 fVar25 * (float)((ulong)local_3d0.m_value >> 0x20) +
                 fStack_3e4 * fVar21 + (float)((ulong)vStack_400.m_value >> 0x20) * fVar20 +
                 fStack_414 * fVar14;
        fVar13 = fVar9 * 0.0 + fVar26 * 0.0 + fVar25 * 0.0 +
                 fVar21 * 0.0 + fVar20 * 0.0 + fVar14 * 0.0;
        fVar14 = fVar9 * 0.0 + fVar26 * 0.0 + fVar25 * 0.0 +
                 fVar21 * 0.0 + fVar20 * 0.0 + fVar14 * 0.0;
        _local_4b8 = &local_578;
        auStack_4b0 = (undefined1  [8])local_4d8;
        local_2f8 = fVar10;
        fStack_2f4 = fVar12;
        Eigen::internal::
        Assignment<Eigen::Matrix<float,_4,_4,_1,_4,_4>,_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>,_Eigen::internal::assign_op<float,_float>,_Eigen::internal::Dense2Dense,_void>
        ::run((Matrix<float,_4,_4,_1,_4,_4> *)local_758,(SrcXprType *)local_4b8,
              (assign_op<float,_float> *)local_7b8);
        local_700[0] = 5.60519e-45;
        local_700[1] = 0.0;
        dst = (XprTypeNested)local_758;
        local_718 = (non_const_type)auStack_4b0;
        uStack_708 = auStack_4b0;
        if (((ulong)auStack_4b0 & 0xf) == 0) {
          dst = (XprTypeNested)local_758;
          local_678 = (float)auStack_74c._0_4_ * *(float *)((long)auStack_4b0 + 0xc) +
                      (float)local_758._4_4_ * *(float *)((long)auStack_4b0 + 4) +
                      (float)local_758._8_4_ * *(float *)((long)auStack_4b0 + 8) +
                      (float)local_758._0_4_ * *(float *)auStack_4b0;
          fStack_674 = uStack_740._4_4_ * *(float *)((long)auStack_4b0 + 0xc) +
                       fStack_744 * *(float *)((long)auStack_4b0 + 4) +
                       (float)uStack_740 * *(float *)((long)auStack_4b0 + 8) +
                       (float)auStack_74c._4_4_ * *(float *)auStack_4b0;
          fStack_670 = uStack_730._4_4_ * *(float *)((long)auStack_4b0 + 0xc) +
                       local_738._4_4_ * *(float *)((long)auStack_4b0 + 4) +
                       (float)uStack_730 * *(float *)((long)auStack_4b0 + 8) +
                       (float)local_738 * *(float *)auStack_4b0;
          fStack_66c = local_728[3] * *(float *)((long)auStack_4b0 + 0xc) +
                       local_728[1] * *(float *)((long)auStack_4b0 + 4) +
                       local_728[2] * *(float *)((long)auStack_4b0 + 8) +
                       local_728[0] * *(float *)auStack_4b0;
          auVar3 = (undefined1  [8])&local_2a8;
          _local_4b8 = &local_298;
          local_710 = (XprTypeNested)local_758;
          Eigen::internal::
          Assignment<Eigen::Matrix<float,_4,_4,_1,_4,_4>,_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>,_Eigen::internal::assign_op<float,_float>,_Eigen::internal::Dense2Dense,_void>
          ::run((Matrix<float,_4,_4,_1,_4,_4> *)dst,(SrcXprType *)local_4b8,
                (assign_op<float,_float> *)local_7b8);
          auStack_4b0 = auVar3;
          local_700[0] = 5.60519e-45;
          local_700[1] = 0.0;
          local_718 = (non_const_type)auStack_4b0;
          uStack_708 = auStack_4b0;
          if (((ulong)auStack_4b0 & 0xf) == 0) {
            fVar25 = (float)auStack_74c._0_4_ * *(float *)((long)auStack_4b0 + 0xc) +
                     (float)local_758._4_4_ * *(float *)((long)auStack_4b0 + 4);
            local_620[10] =
                 fVar25 + (float)local_758._8_4_ * *(float *)((long)auStack_4b0 + 8) +
                          (float)local_758._0_4_ * *(float *)auStack_4b0;
            fVar20 = uStack_740._4_4_ * *(float *)((long)auStack_4b0 + 0xc) +
                     fStack_744 * *(float *)((long)auStack_4b0 + 4);
            fStack_5f4 = fVar20 + (float)uStack_740 * *(float *)((long)auStack_4b0 + 8) +
                                  (float)auStack_74c._4_4_ * *(float *)auStack_4b0;
            fVar21 = uStack_730._4_4_ * *(float *)((long)auStack_4b0 + 0xc) +
                     local_738._4_4_ * *(float *)((long)auStack_4b0 + 4);
            fStack_5f0 = fVar21 + (float)uStack_730 * *(float *)((long)auStack_4b0 + 8) +
                                  (float)local_738 * *(float *)auStack_4b0;
            fStack_5ec = local_728[3] * *(float *)((long)auStack_4b0 + 0xc) +
                         local_728[1] * *(float *)((long)auStack_4b0 + 4) +
                         local_728[2] * *(float *)((long)auStack_4b0 + 8) +
                         local_728[0] * *(float *)auStack_4b0;
            fVar26 = fStack_5f4 * (float)local_688._4_4_ + fStack_5f0 * fStack_680 +
                     local_620[10] * (float)local_688._0_4_;
            auVar27._0_4_ =
                 (fStack_5f4 * fVar12 - fStack_5f0 * fVar10) - fStack_5ec * (float)local_688._0_4_;
            auVar27._4_4_ =
                 (fStack_5f0 * fStack_67c - local_620[10] * fVar12) -
                 fStack_5ec * (float)local_688._4_4_;
            auVar27._8_4_ =
                 ((fVar20 + fVar20) * fVar13 - (fVar21 + fVar21) * fVar13) - fStack_5ec * fStack_680
            ;
            auVar27._12_4_ =
                 ((fVar21 + fVar21) * fVar14 - (fVar25 + fVar25) * fVar14) - fStack_5ec * fStack_67c
            ;
            fVar10 = ((fVar10 * local_620[10] - fStack_67c * fStack_5f4) - fStack_5ec * fStack_680)
                     / fVar26;
            auVar24._4_4_ = fVar26;
            auVar24._0_4_ = fVar26;
            auVar24._8_4_ = fVar26;
            auVar24._12_4_ = fVar26;
            _local_688 = divps(auVar27,auVar24);
            local_6c8._0_4_ = 1.0;
            local_6c8._4_4_ = 0.0;
            local_6c8._8_4_ = 0.0;
            local_6c8._12_4_ = 0.0;
            local_6c8._16_4_ = 0.0;
            local_6c8._20_4_ = 1.0;
            local_6c8._24_4_ = 0.0;
            local_6c8._28_4_ = 0.0;
            stack0xfffffffffffff958 = 0;
            uStack_6a0 = 0x3f800000;
            fStack_68c = 1.0;
            fVar14 = fStack_670 * fStack_650 + fStack_654 * fStack_674 + local_678 * local_658;
            auVar23._0_4_ =
                 (fStack_644 * fStack_674 - fStack_670 * local_648) - fStack_66c * local_658;
            auVar23._4_4_ =
                 (fStack_64c * fStack_670 - local_678 * fStack_644) - fStack_66c * fStack_654;
            auVar23._8_4_ = (fStack_644 * 0.0 - fStack_670 * 0.0) - 0.0;
            auVar23._12_4_ = (fStack_644 * 0.0 - fStack_670 * 0.0) - 0.0;
            fStack_690 = ((local_648 * local_678 - fStack_64c * fStack_674) -
                         fStack_650 * fStack_66c) / fVar14;
            auVar2._4_4_ = fVar14;
            auVar2._0_4_ = fVar14;
            auVar2._8_4_ = fStack_670;
            auVar2._12_4_ = fStack_670;
            auVar24 = divps(auVar23,auVar2);
            _local_698 = auVar24._0_8_;
            local_518._0_4_ = 1.0;
            local_518._4_4_ = 0.0;
            local_518._8_4_ = 0.0;
            fStack_50c = 0.0;
            uStack_508._0_4_ = 0.0;
            uStack_508._4_4_ = 1.0;
            local_500.data = (float *)0x0;
            afStack_4f8[0] = 0.0;
            afStack_4f8[1] = 0.0;
            afStack_4f8[2] = 1.0;
            afStack_4f8[3] = 0.0;
            local_4dc = 1.0;
            afStack_4f8._16_8_ = local_688;
            local_758._0_4_ = 1.0;
            local_758._4_4_ = 0.0;
            local_758._8_4_ = 0.0;
            auStack_74c._0_4_ = 0.0;
            auStack_74c._4_4_ = 0.0;
            fStack_744 = 0.0;
            uStack_740._0_4_ = 0.0;
            uStack_740._4_4_ = 1.0;
            local_738 = 0;
            uStack_730 = (Matrix<float,_4,_4,_0,_4,_4> *)0x0;
            local_728[0] = 0.0;
            local_728[1] = 0.0;
            local_728[2] = 1.0;
            local_728[3] = 0.0;
            local_718._0_4_ = 0.0;
            local_718._4_4_ = 0.0;
            local_710._0_4_ = 0.0;
            local_710._4_4_ = 0.0;
            uStack_708._0_4_ = 0.0;
            uStack_708._4_4_ = 1.0;
            local_700[0] = 0.0;
            local_700[1] = 0.0;
            uStack_6f8 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
                          *)0x0;
            local_6f0 = (Matrix<float,_4,_4,_0,_4,_4> *)0x0;
            local_6e8 = 1.0;
            local_6e4 = 0.0;
            fStack_6e0 = 0.0;
            fStack_6dc = 0.0;
            fStack_6d8 = 0.0;
            local_6d4 = 0.0;
            fStack_6d0 = 0.0;
            local_6cc = 1.0;
            local_4b8 = (undefined1  [4])0x3f800000;
            fStack_4b4 = 0.0;
            auStack_4b0._0_4_ = 0.0;
            auStack_4b0._4_4_ = 0.0;
            uStack_4a8._0_4_ = 0;
            uStack_4a8._4_4_ = 0;
            local_4a0._0_4_ = 0;
            local_4a0._4_4_ = 0x3f800000;
            vStack_498.m_value = 0;
            uStack_490 = 0;
            local_488 = 0;
            fStack_480 = 1.0;
            uStack_47c = 0;
            uStack_474 = 0;
            uStack_470 = 0;
            uStack_46c = 0;
            uStack_468 = 0;
            uStack_464 = 0x3f800000;
            local_460.m_value = 0;
            uStack_458 = 0;
            local_450 = 0;
            local_448 = 0x3f800000;
            local_444 = 0;
            uStack_440 = 0;
            uStack_43c = 0;
            uStack_438 = 0;
            local_434 = 0;
            uStack_430 = 0;
            local_42c = 0x3f800000;
            local_4e0 = fVar10;
            local_e8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array._0_8_ = _local_698;
            local_e8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2] = fStack_690;
            getSkew<float>((Matrix<float,_3,_3,_0,_3,_3> *)local_638,&local_e8);
            local_7b8 = (undefined1  [8])auStack_74c;
            uStack_7b0 = 3;
            local_7a8 = 3;
            local_798 = 3;
            uStack_790 = 0;
            local_788 = 6;
            pfVar7 = (float *)local_120;
            uStack_7a0 = (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                          *)dst;
            local_5a0 = (assign_op<float,_float> *)local_7b8;
            unique0x100047f0 = (Matrix<float,_3,_3,_0,_3,_3> *)local_638;
            local_120[0] = (Matrix<float,_3,_3,_0,_3,_3> *)local_7b8;
            local_5b8._0_8_ = pfVar7;
            unique0x100048c0 = (SrcEvaluatorType *)local_2e8;
            uStack_5a8 = (assign_op<float,_float> *)local_bc;
            Eigen::internal::
            dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
            ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
                   *)local_5b8);
            auVar24 = _local_688;
            local_f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[0] = (float)local_688._0_4_;
            local_f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[1] = (float)local_688._4_4_;
            _local_688 = auVar24;
            local_f8.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2] = fVar10;
            getSkew<float>((Matrix<float,_3,_3,_0,_3,_3> *)local_638,&local_f8);
            local_7b8 = (undefined1  [8])(auStack_4b0 + 4);
            uStack_7b0 = 3;
            local_7a8 = 3;
            local_798 = 3;
            uStack_790 = 0;
            local_788 = 6;
            uStack_7a0 = (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                          *)local_4b8;
            local_5a0 = (assign_op<float,_float> *)local_7b8;
            unique0x100047f8 = (Matrix<float,_3,_3,_0,_3,_3> *)local_638;
            local_120[0] = (Matrix<float,_3,_3,_0,_3,_3> *)local_7b8;
            local_5b8._0_8_ = pfVar7;
            unique0x100049a0 = (SrcEvaluatorType *)local_2e8;
            uStack_5a8 = (assign_op<float,_float> *)local_bc;
            Eigen::internal::
            dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
            ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
                   *)local_5b8);
            fVar14 = fStack_644;
            local_688._4_4_ = fStack_654;
            local_688._0_4_ = local_658;
            fStack_680 = fStack_650;
            fStack_67c = fStack_64c;
            local_528 = local_658 * (float)local_758._0_4_;
            fStack_524 = local_658 * (float)local_758._4_4_;
            fStack_520 = local_658 * (float)local_758._8_4_;
            fStack_51c = local_658 * (float)auStack_74c._0_4_;
            local_188 = CONCAT44(fStack_650,fStack_654);
            uStack_180 = CONCAT44(local_648,fStack_64c);
            local_178 = CONCAT44(uStack_740._4_4_,(float)uStack_740);
            uStack_170 = local_738;
            local_168 = CONCAT44(local_710._4_4_,(float)local_710);
            uStack_160 = CONCAT44(uStack_708._4_4_,(float)uStack_708);
            local_538 = CONCAT44(fStack_6dc,fStack_6e0);
            uStack_530 = CONCAT44(local_6d4,fStack_6d8);
            local_198 = fStack_650 * local_728[0];
            fStack_194 = fStack_650 * local_728[1];
            fStack_190 = fStack_650 * local_728[2];
            fStack_18c = fStack_650 * local_728[3];
            local_158 = local_648 * (float)uStack_6f8;
            fStack_154 = local_648 * uStack_6f8._4_4_;
            fStack_150 = local_648 * (float)local_6f0;
            fStack_14c = local_648 * local_6f0._4_4_;
            local_1e8 = local_308;
            fStack_1e4 = fStack_304;
            fStack_1e0 = fStack_300;
            fStack_1dc = fStack_2fc;
            local_1f8 = local_308 * (float)local_4b8;
            fStack_1f4 = local_308 * fStack_4b4;
            fStack_1f0 = local_308 * (float)auStack_4b0._0_4_;
            fStack_1ec = local_308 * (float)auStack_4b0._4_4_;
            local_228 = CONCAT44(fStack_300,fStack_304);
            uStack_220 = CONCAT44(local_2f8,fStack_2fc);
            local_218 = CONCAT44(local_4a0._4_4_,(undefined4)local_4a0);
            lStack_210 = vStack_498.m_value;
            local_238 = fStack_300 * (float)local_488;
            fStack_234 = fStack_300 * local_488._4_4_;
            fStack_230 = fStack_300 * fStack_480;
            fStack_22c = fStack_300 * (float)uStack_47c;
            local_1d8 = fStack_300;
            fStack_1d4 = fStack_2fc;
            fStack_1d0 = local_2f8;
            fStack_1cc = fStack_2f4;
            local_208 = local_2f8 * (float)uStack_458;
            fStack_204 = local_2f8 * uStack_458._4_4_;
            fStack_200 = local_2f8 * (float)local_450;
            fStack_1fc = local_2f8 * local_450._4_4_;
            local_638._0_8_ = local_6c8;
            unique0x00005300 = &local_678;
            local_258 = CONCAT44(uStack_46c,uStack_470);
            uStack_250 = CONCAT44(uStack_464,uStack_468);
            local_248 = CONCAT44(uStack_43c,uStack_440);
            uStack_240 = CONCAT44(local_434,uStack_438);
            Eigen::internal::
            Assignment<Eigen::Matrix<float,_4,_4,_1,_4,_4>,_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>,_Eigen::internal::assign_op<float,_float>,_Eigen::internal::Dense2Dense,_void>
            ::run((Matrix<float,_4,_4,_1,_4,_4> *)local_7b8,(SrcXprType *)local_638,
                  (assign_op<float,_float> *)local_5b8);
            dst = (XprTypeNested)CONCAT44(local_710._4_4_,(float)local_710);
            local_778 = stack0xfffffffffffff9d0;
            local_760 = 4;
            local_770 = (Matrix<float,_4,_4,_1,_4,_4> *)local_7b8;
            local_768 = local_778;
            if (((ulong)stack0xfffffffffffff9d0 & 0xf) == 0) {
              local_1a8 = *stack0xfffffffffffff9d0;
              fStack_1a4 = stack0xfffffffffffff9d0[1];
              fStack_1a0 = stack0xfffffffffffff9d0[2];
              fStack_19c = stack0xfffffffffffff9d0[3];
              local_1c8 = (float)local_7b8._0_4_ * local_1a8;
              fStack_1c4 = (float)local_7b8._4_4_ * fStack_1a4;
              fStack_1c0 = (float)uStack_7b0 * fStack_1a0;
              fStack_1bc = uStack_7b0._4_4_ * fStack_19c;
              local_1b8 = (float)local_7a8 * local_1a8;
              fStack_1b4 = local_7a8._4_4_ * fStack_1a4;
              fStack_1b0 = (float)uStack_7a0 * fStack_1a0;
              fStack_1ac = uStack_7a0._4_4_ * fStack_19c;
              local_1a8 = local_1a8 * (float)local_798;
              fStack_1a4 = fStack_1a4 * local_798._4_4_;
              fStack_1a0 = fStack_1a0 * (float)uStack_790;
              fStack_19c = fStack_19c * uStack_790._4_4_;
              unique0x00005300 = local_620 + 10;
              local_638._0_8_ =
                   (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
                    *)local_518;
              Eigen::internal::
              Assignment<Eigen::Matrix<float,_4,_4,_1,_4,_4>,_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>,_Eigen::internal::assign_op<float,_float>,_Eigen::internal::Dense2Dense,_void>
              ::run((Matrix<float,_4,_4,_1,_4,_4> *)local_7b8,(SrcXprType *)local_638,
                    (assign_op<float,_float> *)local_5b8);
              dst = (XprTypeNested)CONCAT44(local_710._4_4_,(float)local_710);
              local_778 = stack0xfffffffffffff9d0;
              local_768 = stack0xfffffffffffff9d0;
              local_760 = 4;
              local_770 = (Matrix<float,_4,_4,_1,_4,_4> *)local_7b8;
              if (((ulong)stack0xfffffffffffff9d0 & 0xf) == 0) {
                fVar9 = fVar14 * (float)local_538 +
                        local_158 +
                        fStack_67c * (float)local_168 +
                        local_528 + (float)local_178 * (float)local_188 + local_198;
                fVar12 = fVar14 * local_538._4_4_ +
                         fStack_154 +
                         fStack_67c * local_168._4_4_ +
                         fStack_524 + local_178._4_4_ * (float)local_188 + fStack_194;
                fVar13 = fVar14 * (float)uStack_530 +
                         fStack_150 +
                         fStack_67c * (float)uStack_160 +
                         fStack_520 + (float)uStack_170 * (float)local_188 + fStack_190;
                fVar25 = fStack_1bc + fStack_1c4 + fStack_1c0 + local_1c8;
                fVar26 = fStack_1ac + fStack_1b4 + fStack_1b0 + local_1b8;
                fVar11 = fStack_19c + fStack_1a4 + fStack_1a0 + local_1a8;
                fVar14 = *stack0xfffffffffffff9d0;
                fVar10 = stack0xfffffffffffff9d0[1];
                fVar20 = stack0xfffffffffffff9d0[2];
                fVar21 = stack0xfffffffffffff9d0[3];
                fVar22 = fVar12 * fVar26 + fVar13 * fVar11 + fVar9 * fVar25;
                fVar13 = fVar13 - fVar11 * fVar22;
                fVar9 = fVar9 - fVar22 * fVar25;
                fVar12 = fVar12 - fVar22 * fVar26;
                fVar25 = fVar12 * fVar12 + fVar13 * fVar13 + fVar9 * fVar9;
                if (0.0 < fVar25) {
                  fVar9 = fVar9 / SQRT(fVar25);
                }
                local_528 = (float)local_7b8._0_4_ * fVar14;
                fStack_524 = (float)local_7b8._4_4_ * fVar10;
                fStack_520 = (float)uStack_7b0 * fVar20;
                fStack_51c = uStack_7b0._4_4_ * fVar21;
                local_538 = CONCAT44(local_7a8._4_4_ * fVar10,(float)local_7a8 * fVar14);
                uStack_530 = CONCAT44(uStack_7a0._4_4_ * fVar21,(float)uStack_7a0 * fVar20);
                local_688._4_4_ = fVar10 * local_798._4_4_;
                local_688._0_4_ = fVar14 * (float)local_798;
                fStack_680 = fVar20 * (float)uStack_790;
                fStack_67c = fVar21 * uStack_790._4_4_;
                local_768 = local_778;
                fVar14 = atan2f((float)(~-(uint)(0.0 < fVar25) & (uint)fVar12 |
                                       (uint)(fVar12 / SQRT(fVar25)) & -(uint)(0.0 < fVar25)),fVar9)
                ;
                fVar10 = cosf(fVar14);
                uStack_7b0 = 0;
                local_7a8 = 1;
                uStack_7a0 = (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                              *)0x1;
                local_120[0] = (Matrix<float,_3,_3,_0,_3,_3> *)CONCAT44(local_120[0]._4_4_,fVar10);
                local_7b8 = (undefined1  [8])pfVar7;
                fVar10 = sinf(fVar14);
                local_638._0_4_ = fVar10;
                pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                                   ((CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
                                    local_7b8,(Scalar *)local_638);
                local_5b8._0_4_ = 0.0;
                pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                                   (pCVar4,(Scalar *)local_5b8);
                local_2e8._0_4_ = sinf(fVar14);
                local_2e8._0_4_ = -(float)local_2e8._0_4_;
                pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                                   (pCVar4,(Scalar *)local_2e8);
                local_bc[0] = cosf(fVar14);
                s = local_bc;
                pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                                   (pCVar4,s);
                local_140.m_lhs.m_lhs.m_lhs.m_xpr =
                     (XprTypeNested)((ulong)local_140.m_lhs.m_lhs.m_lhs.m_xpr._4_4_ << 0x20);
                pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                                   (pCVar4,(Scalar *)&local_140);
                local_7bc = 0.0;
                pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                                   (pCVar4,&local_7bc);
                local_65c = 0.0;
                pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                                   (pCVar4,&local_65c);
                local_660 = 1.0;
                Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                          (pCVar4,&local_660);
                if (((long)(((XprTypeNested)uStack_7a0)->
                           super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>).m_storage.
                           m_data.array + uStack_7b0 == 3) && (local_7a8 == 3)) {
                  fVar20 = fStack_1cc * (float)local_248 +
                           local_208 +
                           fStack_1dc * (float)local_258 +
                           local_1f8 + (float)local_218 * (float)local_228 + local_238;
                  fVar21 = fStack_1cc * local_248._4_4_ +
                           fStack_204 +
                           fStack_1dc * local_258._4_4_ +
                           fStack_1f4 + local_218._4_4_ * (float)local_228 + fStack_234;
                  fVar25 = fStack_1cc * (float)uStack_240 +
                           fStack_200 +
                           fStack_1dc * (float)uStack_250 +
                           fStack_1f0 + (float)lStack_210 * (float)local_228 + fStack_230;
                  fVar14 = fStack_51c + fStack_524 + fStack_520 + local_528;
                  fVar10 = uStack_530._4_4_ + local_538._4_4_ + (float)uStack_530 + (float)local_538
                  ;
                  fVar26 = fStack_67c + (float)local_688._4_4_ + fStack_680 + (float)local_688._0_4_
                  ;
                  local_638._0_4_ = 1.0;
                  local_638._4_4_ = 0.0;
                  local_638._8_4_ = 0.0;
                  fStack_62c = 0.0;
                  fStack_628 = 0.0;
                  local_624 = 1.0;
                  local_620[0] = 0.0;
                  local_620[1] = 0.0;
                  local_620[2] = 0.0;
                  local_620[3] = 0.0;
                  local_620[4] = 1.0;
                  local_620[5] = 0.0;
                  local_620[6] = 0.0;
                  local_620[7] = 0.0;
                  local_620[8] = 0.0;
                  local_620[9] = 1.0;
                  lVar5 = 0;
                  do {
                    *(float *)(local_638 + lVar5 + 8) = pfVar7[2];
                    *(Matrix<float,_3,_3,_0,_3,_3> **)(local_638 + lVar5) =
                         *(Matrix<float,_3,_3,_0,_3,_3> **)pfVar7;
                    pfVar7 = pfVar7 + 3;
                    lVar5 = lVar5 + 0x10;
                  } while (lVar5 != 0x30);
                  fVar9 = fVar21 * fVar10 + fVar25 * fVar26 + fVar20 * fVar14;
                  fVar25 = fVar25 - fVar26 * fVar9;
                  fVar20 = fVar20 - fVar9 * fVar14;
                  fVar21 = fVar21 - fVar9 * fVar10;
                  fVar14 = fVar21 * fVar21 + fVar25 * fVar25 + fVar20 * fVar20;
                  if (0.0 < fVar14) {
                    fVar20 = fVar20 / SQRT(fVar14);
                  }
                  fVar14 = atan2f((float)(~-(uint)(0.0 < fVar14) & (uint)fVar21 |
                                         (uint)(fVar21 / SQRT(fVar14)) & -(uint)(0.0 < fVar14)),
                                  fVar20);
                  local_bc[0] = cosf(fVar14);
                  uStack_7b0 = 0;
                  local_7a8 = 1;
                  uStack_7a0 = (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                                *)0x1;
                  local_7b8 = (undefined1  [8])s;
                  local_5b8._0_4_ = sinf(fVar14);
                  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                                     ((CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
                                      local_7b8,(Scalar *)local_5b8);
                  local_2e8._0_4_ = 0.0;
                  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                                     (pCVar4,(Scalar *)local_2e8);
                  fVar10 = sinf(fVar14);
                  local_140.m_lhs.m_lhs.m_lhs.m_xpr =
                       (XprTypeNested)
                       (CONCAT44(local_140.m_lhs.m_lhs.m_lhs.m_xpr._4_4_,fVar10) ^ 0x80000000);
                  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                                     (pCVar4,(Scalar *)&local_140);
                  local_7bc = cosf(fVar14);
                  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                                     (pCVar4,&local_7bc);
                  local_65c = 0.0;
                  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                                     (pCVar4,&local_65c);
                  local_660 = 0.0;
                  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                                     (pCVar4,&local_660);
                  local_4bc = 0.0;
                  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                                     (pCVar4,&local_4bc);
                  local_4c0 = 1.0;
                  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                            (pCVar4,&local_4c0);
                  unique0x100048e8 = (float *)CONCAT44(fStack_62c,local_638._8_4_);
                  if (((long)(((XprTypeNested)uStack_7a0)->
                             super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>).m_storage.
                             m_data.array + uStack_7b0 == 3) &&
                     (unique0x100048f0 = (float *)CONCAT44(fStack_62c,local_638._8_4_),
                     local_7a8 == 3)) {
                    local_5b8._0_4_ = 1.0;
                    local_5b8._4_4_ = 0.0;
                    local_5b8._8_4_ = 0.0;
                    fStack_5ac = 0.0;
                    uStack_5a8._0_4_ = 0.0;
                    uStack_5a8._4_4_ = 1.0;
                    local_5a0 = (assign_op<float,_float> *)0x0;
                    afStack_598[0] = 0.0;
                    afStack_598[1] = 0.0;
                    afStack_598[2] = 1.0;
                    afStack_598[3] = 0.0;
                    afStack_598[4] = 0.0;
                    afStack_598[5] = 0.0;
                    afStack_598[6] = 0.0;
                    afStack_598[7] = 1.0;
                    lVar5 = 0;
                    do {
                      *(float *)(local_5b8 + lVar5 + 8) = s[2];
                      *(Matrix<float,_3,_3,_0,_3,_3> **)(local_5b8 + lVar5) =
                           *(Matrix<float,_3,_3,_0,_3,_3> **)s;
                      s = s + 3;
                      lVar5 = lVar5 + 0x10;
                    } while (lVar5 != 0x30);
                    local_140.m_lhs.m_lhs.m_rhs.m_xpr = (XprTypeNested)local_518;
                    local_140.m_lhs.m_lhs.m_lhs.m_xpr = &local_298;
                    local_140.m_lhs.m_rhs.m_xpr = (XprTypeNested)local_5b8;
                    local_140.m_rhs = (RhsNested)local_638;
                    Eigen::internal::
                    call_dense_assignment_loop<Eigen::Matrix<float,4,4,0,4,4>,Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,0>,Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,0>,Eigen::Matrix<float,4,4,0,4,4>,1>,Eigen::internal::assign_op<float,float>>
                              ((Matrix<float,_4,_4,_0,_4,_4> *)local_7b8,&local_140,
                               (assign_op<float,_float> *)&local_7bc);
                    fVar14 = (float)local_6c8._12_4_ * (float)local_788 +
                             (float)local_6c8._8_4_ * (float)local_798 +
                             (float)local_6c8._4_4_ * (float)local_7a8 +
                             (float)local_6c8._0_4_ * (float)local_7b8._0_4_;
                    fVar10 = (float)local_6c8._12_4_ * local_788._4_4_ +
                             (float)local_6c8._8_4_ * local_798._4_4_ +
                             (float)local_6c8._4_4_ * local_7a8._4_4_ +
                             (float)local_6c8._0_4_ * (float)local_7b8._4_4_;
                    fVar20 = (float)local_6c8._12_4_ * fStack_780 +
                             (float)local_6c8._8_4_ * (float)uStack_790 +
                             (float)local_6c8._4_4_ * (float)uStack_7a0 +
                             (float)local_6c8._0_4_ * (float)uStack_7b0;
                    fVar21 = (float)local_6c8._12_4_ * fStack_77c +
                             (float)local_6c8._8_4_ * uStack_790._4_4_ +
                             (float)local_6c8._4_4_ * uStack_7a0._4_4_ +
                             (float)local_6c8._0_4_ * uStack_7b0._4_4_;
                    fVar25 = (float)local_6c8._28_4_ * (float)local_788 +
                             (float)local_6c8._24_4_ * (float)local_798 +
                             (float)local_6c8._20_4_ * (float)local_7a8 +
                             (float)local_6c8._16_4_ * (float)local_7b8._0_4_;
                    fVar26 = (float)local_6c8._28_4_ * local_788._4_4_ +
                             (float)local_6c8._24_4_ * local_798._4_4_ +
                             (float)local_6c8._20_4_ * local_7a8._4_4_ +
                             (float)local_6c8._16_4_ * (float)local_7b8._4_4_;
                    fVar9 = (float)local_6c8._28_4_ * fStack_780 +
                            (float)local_6c8._24_4_ * (float)uStack_790 +
                            (float)local_6c8._20_4_ * (float)uStack_7a0 +
                            (float)local_6c8._16_4_ * (float)uStack_7b0;
                    fVar12 = (float)local_6c8._28_4_ * fStack_77c +
                             (float)local_6c8._24_4_ * uStack_790._4_4_ +
                             (float)local_6c8._20_4_ * uStack_7a0._4_4_ +
                             (float)local_6c8._16_4_ * uStack_7b0._4_4_;
                    fVar13 = uStack_6a0._4_4_ * (float)local_788 +
                             (float)uStack_6a0 * (float)local_798 +
                             fStack_6a4 * (float)local_7a8 +
                             (float)local_6c8._32_4_ * (float)local_7b8._0_4_;
                    fVar11 = uStack_6a0._4_4_ * local_788._4_4_ +
                             (float)uStack_6a0 * local_798._4_4_ +
                             fStack_6a4 * local_7a8._4_4_ +
                             (float)local_6c8._32_4_ * (float)local_7b8._4_4_;
                    fVar22 = uStack_6a0._4_4_ * fStack_780 +
                             (float)uStack_6a0 * (float)uStack_790 +
                             fStack_6a4 * (float)uStack_7a0 +
                             (float)local_6c8._32_4_ * (float)uStack_7b0;
                    fVar15 = uStack_6a0._4_4_ * fStack_77c +
                             (float)uStack_6a0 * uStack_790._4_4_ +
                             fStack_6a4 * uStack_7a0._4_4_ +
                             (float)local_6c8._32_4_ * uStack_7b0._4_4_;
                    fVar16 = fStack_68c * (float)local_788 +
                             fStack_690 * (float)local_798 +
                             fStack_694 * (float)local_7a8 + local_698 * (float)local_7b8._0_4_;
                    fVar17 = fStack_68c * local_788._4_4_ +
                             fStack_690 * local_798._4_4_ +
                             fStack_694 * local_7a8._4_4_ + local_698 * (float)local_7b8._4_4_;
                    fVar18 = fStack_68c * fStack_780 +
                             fStack_690 * (float)uStack_790 +
                             fStack_694 * (float)uStack_7a0 + local_698 * (float)uStack_7b0;
                    fVar19 = fStack_68c * fStack_77c +
                             fStack_690 * uStack_790._4_4_ +
                             fStack_694 * uStack_7a0._4_4_ + local_698 * uStack_7b0._4_4_;
                    local_2e8._0_4_ =
                         local_578.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                         m_storage.m_data.array[3] * fVar16 +
                         local_578.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                         m_storage.m_data.array[2] * fVar13 +
                         local_578.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                         m_storage.m_data.array[1] * fVar25 +
                         local_578.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                         m_storage.m_data.array[0] * fVar14;
                    local_2e8._4_4_ =
                         local_578.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                         m_storage.m_data.array[3] * fVar17 +
                         local_578.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                         m_storage.m_data.array[2] * fVar11 +
                         local_578.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                         m_storage.m_data.array[1] * fVar26 +
                         local_578.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                         m_storage.m_data.array[0] * fVar10;
                    stack0xfffffffffffffd20 =
                         (Matrix<float,_3,_3,_0,_3,_3> *)
                         CONCAT44(local_578.
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[3] * fVar19 +
                                  local_578.
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[2] * fVar15 +
                                  local_578.
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[1] * fVar12 +
                                  local_578.
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[0] * fVar21,
                                  local_578.
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[3] * fVar18 +
                                  local_578.
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[2] * fVar22 +
                                  local_578.
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[1] * fVar9 +
                                  local_578.
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[0] * fVar20);
                    local_2d8 = local_578.
                                super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[7] * fVar16 +
                                local_578.
                                super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[6] * fVar13 +
                                local_578.
                                super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[5] * fVar25 +
                                local_578.
                                super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[4] * fVar14;
                    fStack_2d4 = local_578.
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array[7] * fVar17 +
                                 local_578.
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array[6] * fVar11 +
                                 local_578.
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array[5] * fVar26 +
                                 local_578.
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array[4] * fVar10;
                    fStack_2d0 = local_578.
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array[7] * fVar18 +
                                 local_578.
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array[6] * fVar22 +
                                 local_578.
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array[5] * fVar9 +
                                 local_578.
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array[4] * fVar20;
                    fStack_2cc = local_578.
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array[7] * fVar19 +
                                 local_578.
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array[6] * fVar15 +
                                 local_578.
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array[5] * fVar12 +
                                 local_578.
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array[4] * fVar21;
                    local_2c8 = local_578.
                                super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0xb] * fVar16 +
                                local_578.
                                super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[10] * fVar13 +
                                local_578.
                                super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[9] * fVar25 +
                                local_578.
                                super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[8] * fVar14;
                    fStack_2c4 = local_578.
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array[0xb] * fVar17 +
                                 local_578.
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array[10] * fVar11 +
                                 local_578.
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array[9] * fVar26 +
                                 local_578.
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array[8] * fVar10;
                    fStack_2c0 = local_578.
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array[0xb] * fVar18 +
                                 local_578.
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array[10] * fVar22 +
                                 local_578.
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array[9] * fVar9 +
                                 local_578.
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array[8] * fVar20;
                    fStack_2bc = local_578.
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array[0xb] * fVar19 +
                                 local_578.
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array[10] * fVar15 +
                                 local_578.
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array[9] * fVar12 +
                                 local_578.
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array[8] * fVar21;
                    local_2b8 = local_578.
                                super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0xf] * fVar16 +
                                local_578.
                                super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0xe] * fVar13 +
                                local_578.
                                super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0xd] * fVar25 +
                                local_578.
                                super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0xc] * fVar14;
                    fStack_2b4 = local_578.
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array[0xf] * fVar17 +
                                 local_578.
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array[0xe] * fVar11 +
                                 local_578.
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array[0xd] * fVar26 +
                                 local_578.
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array[0xc] * fVar10;
                    fStack_2b0 = local_578.
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array[0xf] * fVar18 +
                                 local_578.
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array[0xe] * fVar22 +
                                 local_578.
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array[0xd] * fVar9 +
                                 local_578.
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array[0xc] * fVar20;
                    fStack_2ac = local_578.
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array[0xf] * fVar19 +
                                 local_578.
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array[0xe] * fVar15 +
                                 local_578.
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array[0xd] * fVar12 +
                                 local_578.
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                 m_storage.m_data.array[0xc] * fVar21;
                    __position._M_current =
                         (__return_storage_ptr__->
                         super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
                    if (__position._M_current ==
                        (__return_storage_ptr__->
                        super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::
                      vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
                      ::_M_realloc_insert<Eigen::Matrix<float,4,4,0,4,4>const&>
                                ((vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
                                  *)__return_storage_ptr__,__position,
                                 (Matrix<float,_4,_4,_0,_4,_4> *)local_2e8);
                    }
                    else {
                      *(ulong *)(((__position._M_current)->
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
                                 m_storage.m_data.array + 0xc) = CONCAT44(fStack_2b4,local_2b8);
                      *(ulong *)(((__position._M_current)->
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
                                 m_storage.m_data.array + 0xe) = CONCAT44(fStack_2ac,fStack_2b0);
                      *(ulong *)(((__position._M_current)->
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
                                 m_storage.m_data.array + 8) = CONCAT44(fStack_2c4,local_2c8);
                      *(ulong *)(((__position._M_current)->
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
                                 m_storage.m_data.array + 10) = CONCAT44(fStack_2bc,fStack_2c0);
                      *(ulong *)(((__position._M_current)->
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
                                 m_storage.m_data.array + 4) = CONCAT44(fStack_2d4,local_2d8);
                      *(ulong *)(((__position._M_current)->
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
                                 m_storage.m_data.array + 6) = CONCAT44(fStack_2cc,fStack_2d0);
                      *(ulong *)((__position._M_current)->
                                super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
                                m_storage.m_data.array = CONCAT44(local_2e8._4_4_,local_2e8._0_4_);
                      *(Matrix<float,_3,_3,_0,_3,_3> **)
                       (((__position._M_current)->
                        super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
                        m_data.array + 2) = stack0xfffffffffffffd20;
                      (__return_storage_ptr__->
                      super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
                    }
                    if (local_5e8.
                        super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_5e8.
                                      super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_5e8.
                                            super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_5e8.
                                            super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    goto LAB_001a8ef4;
                  }
                }
                __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                              ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                              "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 3, 3>>::finished() [MatrixType = Eigen::Matrix<float, 3, 3>]"
                             );
              }
            }
          }
        }
        local_710 = dst;
        __assert_fail("((internal::UIntPtr(block.data()) % (((int)1 >= (int)evaluator<XprType>::Alignment) ? (int)1 : (int)evaluator<XprType>::Alignment)) == 0) && \"data is not aligned\""
                      ,"/usr/include/eigen3/Eigen/src/Core/CoreEvaluators.h",0x4ca,
                      "Eigen::internal::block_evaluator<const Eigen::Matrix<float, 4, 1>, 4, 1, true>::block_evaluator(const XprType &) [ArgType = const Eigen::Matrix<float, 4, 1>, BlockRows = 4, BlockCols = 1, InnerPanel = true, HasDirectAccess = true]"
                     );
      }
    }
    local_638._0_8_ = local_4b8;
    __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                  "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float, 6, 6>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<float, 6, 6>>]"
                 );
  }
LAB_001a8ef4:
  if (local_5d0.
      super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5d0.
                    super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_5d0.
                          super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_5d0.
                          super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Eigen::Matrix<floatPrec, 4, 4>> solver1M1P(
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair){

	// check input vectors size
	if(lCPair.size() < 1 && plPair.size() < 2){
		std::cerr << "Solver 1M1P requires at least 1 line and 1 plane correspondence!" << std::endl;
		exit(-1);
	}

	std::vector<Eigen::Matrix<floatPrec,4,4>> out;
	out.clear();

	// parse inputs
	Eigen::Matrix<floatPrec, 4, 1> Pi, Nu;
	Pi = plPair[0].first; Nu = plPair[0].second;
	// get lines in plucker coordinates
	std::vector<Eigen::Matrix<floatPrec,6,1>> lines1 = getPluckerCoord(lCPair[0]);

	// check if line and plane are parallel
	if(abs(Pi.head(3).dot(lines1[0].head(3))) < 1e-6){
		// std::cout << Pi.head(3).transpose() << "   " << lines1[0].head(3).transpose() << std::endl; 
		// std::cout << lCPair[0].first.second.head(3).transpose() << "  " << lCPair[0].first.first.head(3).transpose() << std::endl;
		// std::cerr << "Solver 1M1P: The line and plane cannot be parallel!" << std::endl;
		return out;
		// exit(-1);
	}

	// get the predefined transformation matrices
	vector<Matrix<floatPrec, 4, 4>> predTrans = getPredefinedTransformations1Plane3Line<floatPrec>(Pi, Nu);
	Matrix<floatPrec, 4, 4> TU2 = predTrans.back();
	predTrans.pop_back();
	Matrix<floatPrec, 4, 4> TU1 = predTrans.back();
	predTrans.pop_back();

	Eigen::Matrix<floatPrec,6,6> TUL1 = Eigen::Matrix<floatPrec,6,6>::Identity(), TUL2 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TUL1.topLeftCorner(3,3) = TU1.topLeftCorner(3,3);
	TUL1.block(3,3,3,3) = TU1.topLeftCorner(3,3);
	TUL1.block(3,0,3,3) = -getSkew<floatPrec>(TU1.topRightCorner(3,1))*TU1.topLeftCorner(3,3);
	TUL2.topLeftCorner(3,3) = TU2.topLeftCorner(3,3);
	TUL2.block(3,3,3,3) = TU2.topLeftCorner(3,3);
	TUL2.block(3,0,3,3) = -getSkew<floatPrec>(TU2.topRightCorner(3,1))*TU2.topLeftCorner(3,3);

	// transform features
	Eigen::Matrix<floatPrec,6,1> lU1 = TUL1*lines1[0];
	Eigen::Matrix<floatPrec,6,1> lU2 = TUL2*lines1[1];
	Eigen::Matrix<floatPrec,4,1> PiU = TU1.transpose().inverse()*Pi;
	Eigen::Matrix<floatPrec,4,1> NuU = TU2.transpose().inverse()*Nu;
	
	// get direction and moment vectors
	Eigen::Matrix<floatPrec,3,1> dir1 = lU1.head(3), m1 = lU1.tail(3);
	Eigen::Matrix<floatPrec,3,1> dir2 = lU2.head(3), m2 = lU2.tail(3);
	Eigen::Matrix<floatPrec,3,1> n1 = PiU.head(3), n2 = NuU.head(3);

	// compute intersection line with plane
	Eigen::Matrix<floatPrec,3,1> p1 = (n1.cross(m1) - PiU(3)*dir1)/(n1.dot(dir1));
	Eigen::Matrix<floatPrec,3,1> p2 = (n2.cross(m2) - NuU(3)*dir2)/(n2.dot(dir2));

	Matrix<floatPrec, 4, 4> Tu1 = Matrix<floatPrec, 4, 4>::Identity();
	Tu1.topRightCorner(3,1) = p1;
	Matrix<floatPrec, 4, 4> Tu2 = Matrix<floatPrec, 4, 4>::Identity();
	Tu2.topRightCorner(3,1) = p2;
	Eigen::Matrix<floatPrec,6,6> TuL1 = Eigen::Matrix<floatPrec,6,6>::Identity(), TuL2 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TuL1.block(3,0,3,3) = -getSkew<floatPrec>(p1);
	TuL2.block(3,0,3,3) = -getSkew<floatPrec>(p2);

	// transform features
	Eigen::Matrix<floatPrec,6,1> lu1 = TuL1*lU1;
	Eigen::Matrix<floatPrec,6,1> lu2 = TuL2*lU2;
	Eigen::Matrix<floatPrec,4,1> Piu = Tu1.transpose().inverse()*PiU;
	Eigen::Matrix<floatPrec,4,1> Nuu = Tu2.transpose().inverse()*NuU;

	// align x axis wiht projection of line direction to plane
	// project line direction to plane
	dir1 = lu1.head(3); m1 = lu1.tail(3);
	dir2 = lu2.head(3); m2 = lu2.tail(3);
	n1 = Piu.head(3); n2 = Nuu.head(3);
	// frame A
	Eigen::Matrix<floatPrec,3,1> w = (dir1 - dir1.dot(n1)*n1).normalized();
	floatPrec alpha1 = atan2(w(1),w(0));
	Eigen::Matrix<floatPrec,3,3> V1;
	V1 << cos(alpha1),sin(alpha1),0,-sin(alpha1),cos(alpha1),0,0,0,1;
	Eigen::Matrix<floatPrec,4,4> TV1 = Eigen::Matrix<floatPrec,4,4>::Identity();
	TV1.topLeftCorner(3,3) = V1;
	// frame B
	Eigen::Matrix<floatPrec,3,1> w2 = (dir2 - dir2.dot(n2)*n2).normalized();
	floatPrec alpha2 = atan2(w2(1),w2(0));
	Eigen::Matrix<floatPrec,3,3> V2;
	V2 << cos(alpha2),sin(alpha2),0,-sin(alpha2),cos(alpha2),0,0,0,1;
	Eigen::Matrix<floatPrec,4,4> TV2 = Eigen::Matrix<floatPrec,4,4>::Identity();
	TV2.topLeftCorner(3,3) = V2;

	Eigen::Matrix<floatPrec,4,4> sol = TU2.inverse()*Tu2.inverse()*TV2.inverse()*TV1*Tu1*TU1;
	out.push_back(sol);

	return out;
}